

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse(Parser *this,string *exeName,TokenStream *tokens)

{
  ParserBase *pPVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ParseResultType PVar5;
  size_type sVar6;
  size_type sVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParseState *pPVar8;
  undefined8 in_RDX;
  long in_RSI;
  InternalParseResult *in_RDI;
  ParserInfo *parseInfo;
  size_t i_1;
  bool tokenParsed;
  BasicResult<Catch::clara::detail::ParseState> result;
  Arg *arg;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> *__range3_1;
  Opt *opt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *__range3;
  size_t i;
  ParserInfo parseInfos [512];
  size_t totalParsers;
  undefined4 in_stack_ffffffffffffdce8;
  ParseResultType in_stack_ffffffffffffdcec;
  BasicResult<Catch::clara::detail::ParseState> *in_stack_ffffffffffffdcf0;
  ParseState *in_stack_ffffffffffffdd30;
  char *in_stack_ffffffffffffdd38;
  string *in_stack_ffffffffffffdd40;
  ExeName *in_stack_ffffffffffffdd48;
  ParserInfo *local_2280;
  string local_2230 [36];
  undefined4 local_220c;
  undefined1 local_2208 [40];
  undefined1 local_21e0 [96];
  ParserInfo *local_2180;
  ParserBase *local_2178;
  byte local_2169;
  BasicResult local_2100 [144];
  reference local_2070;
  Arg *local_2068;
  __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
  local_2060;
  long local_2058;
  reference local_2050;
  Opt *local_2048;
  __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
  local_2040;
  long local_2038;
  long local_2030;
  ParserInfo local_2028 [512];
  ParserInfo local_28;
  undefined8 local_18;
  
  local_18 = in_RDX;
  sVar6 = std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::size
                    ((vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                      *)(in_RSI + 0x30));
  sVar7 = std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::size
                    ((vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                      *)(in_RSI + 0x48));
  local_28.parser = (ParserBase *)(sVar6 + sVar7);
  if ((ParserBase *)0x1ff < local_28.parser) {
    __assert_fail("totalParsers < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                  ,0x2585,
                  "virtual InternalParseResult Catch::clara::detail::Parser::parse(const std::string &, const TokenStream &) const"
                 );
  }
  local_2280 = local_2028;
  do {
    parse::ParserInfo::ParserInfo(local_2280);
    local_2280 = local_2280 + 1;
  } while (local_2280 != &local_28);
  local_2030 = 0;
  local_2038 = in_RSI + 0x30;
  local_2040._M_current =
       (Opt *)std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
              begin((vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *
                    )CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
  local_2048 = (Opt *)std::
                      vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                      ::end((vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                             *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
                             *)in_stack_ffffffffffffdcf0,
                            (__normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
                             *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8)), bVar3
        ) {
    local_2050 = __gnu_cxx::
                 __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
                 ::operator*(&local_2040);
    local_2028[local_2030].parser = (ParserBase *)local_2050;
    local_2030 = local_2030 + 1;
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
    ::operator++(&local_2040);
  }
  local_2058 = in_RSI + 0x48;
  local_2060._M_current =
       (Arg *)std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::
              begin((vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> *
                    )CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
  local_2068 = (Arg *)std::
                      vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                      ::end((vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                             *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                             *)in_stack_ffffffffffffdcf0,
                            (__normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                             *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8)), bVar3
        ) {
    local_2070 = __gnu_cxx::
                 __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                 ::operator*(&local_2060);
    local_2028[local_2030].parser = (ParserBase *)local_2070;
    local_2030 = local_2030 + 1;
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
    ::operator++(&local_2060);
  }
  ExeName::set(in_stack_ffffffffffffdd48,in_stack_ffffffffffffdd40);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
            ((BasicResult<Catch::clara::detail::ParseResultType> *)in_stack_ffffffffffffdcf0);
  ParseState::ParseState
            ((ParseState *)in_stack_ffffffffffffdcf0,in_stack_ffffffffffffdcec,
             (TokenStream *)0x34cb73);
  BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
            ((ParseState *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
  ParseState::~ParseState((ParseState *)0x34cb97);
  do {
    ResultValueBase<Catch::clara::detail::ParseState>::value
              (&in_stack_ffffffffffffdcf0->super_ResultValueBase<Catch::clara::detail::ParseState>);
    ParseState::remainingTokens
              ((ParseState *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
    bVar3 = TokenStream::operator_cast_to_bool((TokenStream *)in_stack_ffffffffffffdcf0);
    TokenStream::~TokenStream((TokenStream *)0x34cbdd);
    if (!bVar3) {
      BasicResult<Catch::clara::detail::ParseState>::BasicResult
                (in_stack_ffffffffffffdcf0,
                 (BasicResult<Catch::clara::detail::ParseState> *)
                 CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
      goto LAB_0034cfbf;
    }
    local_2169 = 0;
    for (local_2178 = (ParserBase *)0x0; local_2178 < local_28.parser;
        local_2178 = (ParserBase *)((long)&local_2178->_vptr_ParserBase + 1)) {
      local_2180 = local_2028 + (long)local_2178;
      iVar4 = (*local_2180->parser->_vptr_ParserBase[4])();
      if (CONCAT44(extraout_var,iVar4) == 0) {
LAB_0034cc8d:
        uVar2 = local_18;
        pPVar1 = local_2180->parser;
        in_stack_ffffffffffffdd30 =
             ResultValueBase<Catch::clara::detail::ParseState>::value
                       (&in_stack_ffffffffffffdcf0->
                         super_ResultValueBase<Catch::clara::detail::ParseState>);
        ParseState::remainingTokens
                  ((ParseState *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
        (*pPVar1->_vptr_ParserBase[3])(local_21e0,pPVar1,uVar2,local_2208);
        BasicResult<Catch::clara::detail::ParseState>::operator=
                  (in_stack_ffffffffffffdcf0,
                   (BasicResult<Catch::clara::detail::ParseState> *)
                   CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
        BasicResult<Catch::clara::detail::ParseState>::~BasicResult(in_stack_ffffffffffffdcf0);
        TokenStream::~TokenStream((TokenStream *)0x34cd28);
        bVar3 = BasicResult::operator_cast_to_bool(local_2100);
        if (!bVar3) {
          BasicResult<Catch::clara::detail::ParseState>::BasicResult
                    (in_stack_ffffffffffffdcf0,
                     (BasicResult<Catch::clara::detail::ParseState> *)
                     CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
          goto LAB_0034cfbf;
        }
        pPVar8 = ResultValueBase<Catch::clara::detail::ParseState>::value
                           (&in_stack_ffffffffffffdcf0->
                             super_ResultValueBase<Catch::clara::detail::ParseState>);
        PVar5 = ParseState::type(pPVar8);
        if (PVar5 != NoMatch) {
          local_2169 = 1;
          local_2180->count = local_2180->count + 1;
          break;
        }
      }
      else {
        in_stack_ffffffffffffdd38 = (char *)local_2180->count;
        iVar4 = (*local_2180->parser->_vptr_ParserBase[4])();
        if (in_stack_ffffffffffffdd38 < (char *)CONCAT44(extraout_var_00,iVar4)) goto LAB_0034cc8d;
      }
    }
    pPVar8 = ResultValueBase<Catch::clara::detail::ParseState>::value
                       (&in_stack_ffffffffffffdcf0->
                         super_ResultValueBase<Catch::clara::detail::ParseState>);
    PVar5 = ParseState::type(pPVar8);
    if (PVar5 == ShortCircuitAll) {
      BasicResult<Catch::clara::detail::ParseState>::BasicResult
                (in_stack_ffffffffffffdcf0,
                 (BasicResult<Catch::clara::detail::ParseState> *)
                 CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
      goto LAB_0034cfbf;
    }
    if ((local_2169 & 1) == 0) {
      in_stack_ffffffffffffdcf0 =
           (BasicResult<Catch::clara::detail::ParseState> *)
           ResultValueBase<Catch::clara::detail::ParseState>::value
                     (&in_stack_ffffffffffffdcf0->
                       super_ResultValueBase<Catch::clara::detail::ParseState>);
      ParseState::remainingTokens
                ((ParseState *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
      TokenStream::operator->((TokenStream *)in_stack_ffffffffffffdcf0);
      ::std::operator+(in_stack_ffffffffffffdd38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffdd30);
      BasicResult<Catch::clara::detail::ParseState>::runtimeError
                ((string *)CONCAT44(in_stack_ffffffffffffdcec,in_stack_ffffffffffffdce8));
      ::std::__cxx11::string::~string(local_2230);
      TokenStream::~TokenStream((TokenStream *)0x34cf45);
LAB_0034cfbf:
      local_220c = 1;
      BasicResult<Catch::clara::detail::ParseState>::~BasicResult(in_stack_ffffffffffffdcf0);
      return in_RDI;
    }
  } while( true );
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }